

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

int __thiscall
embree::QuadMesh::verify
          (QuadMesh *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  BufferView<embree::Vec3fa> *pBVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  iterator __begin1;
  BufferView<embree::Vec3fa> *pBVar6;
  uint *puVar7;
  float *pfVar8;
  undefined4 uVar9;
  ulong uVar10;
  
  sVar5 = (this->vertices).size_active;
  if (sVar5 == 0) {
LAB_00983a44:
    iVar3 = 0;
  }
  else {
    pBVar6 = (this->vertices).items;
    pBVar1 = pBVar6 + sVar5;
    uVar10 = 0;
    do {
      if (*(size_t *)((long)&(pBVar6->super_RawBufferView).num + uVar10) !=
          (pBVar6->super_RawBufferView).num) goto LAB_00983a44;
      uVar10 = uVar10 + 0x38;
    } while (sVar5 * 0x38 - uVar10 != 0);
    uVar4 = (ulong)(this->super_Geometry).numPrimitives;
    if (uVar4 != 0) {
      uVar10 = (pBVar6->super_RawBufferView).num;
      puVar7 = (uint *)(*(long *)&(this->super_Geometry).field_0x58 + 0xc);
      do {
        if ((((uVar10 <= puVar7[-3]) || (uVar10 <= puVar7[-2])) || (uVar10 <= puVar7[-1])) ||
           (uVar10 <= *puVar7)) goto LAB_00983a44;
        puVar7 = (uint *)((long)puVar7 + *(long *)&this->field_0x68);
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    do {
      sVar5 = (pBVar6->super_RawBufferView).num;
      if (sVar5 != 0) {
        pfVar8 = (float *)(pBVar6->super_RawBufferView).ptr_ofs;
        do {
          auVar2._4_4_ = -(uint)(pfVar8[1] < 1.844e+18 && -1.844e+18 < pfVar8[1]);
          auVar2._0_4_ = -(uint)(*pfVar8 < 1.844e+18 && -1.844e+18 < *pfVar8);
          auVar2._8_4_ = -(uint)(pfVar8[2] < 1.844e+18 && -1.844e+18 < pfVar8[2]);
          auVar2._12_4_ = -(uint)(pfVar8[3] < 1.844e+18 && -1.844e+18 < pfVar8[3]);
          uVar9 = movmskps((int)uVar10,auVar2);
          uVar10 = (ulong)CONCAT31((int3)((uint)uVar9 >> 8),~(byte)uVar9);
          if ((~(byte)uVar9 & 7) != 0) goto LAB_00983a44;
          pfVar8 = (float *)((long)pfVar8 + (pBVar6->super_RawBufferView).stride);
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
      pBVar6 = pBVar6 + 1;
      iVar3 = (int)CONCAT71((int7)(sVar5 >> 8),1);
    } while (pBVar6 != pBVar1);
  }
  return iVar3;
}

Assistant:

__forceinline size_t size     () const { return size_active; }